

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileBind
          (MultiFileFunction<duckdb::ParquetMultiFileInfo> *this,ClientContext *context,
          TableFunctionBindInput *input,vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  case_insensitive_map_t<Value> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  ClientContext *context_00;
  reference pvVar6;
  pointer pMVar7;
  type base_options;
  NotImplementedException *this_01;
  pointer *__ptr;
  _Hash_node_base *p_Var8;
  undefined1 local_218 [16];
  _Alloc_hider local_208;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_200;
  shared_ptr<duckdb::MultiFileList,_true> file_list;
  undefined1 local_1e8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  string local_1c0;
  string loption;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  MultiFileOptions local_160;
  MultiFileOptions local_c8;
  
  MultiFileReader::Create((MultiFileReader *)(local_218 + 8),input->table_function);
  context_00 = (ClientContext *)
               unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
               ::operator->((unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                             *)(local_218 + 8));
  pvVar6 = vector<duckdb::Value,_true>::operator[](input->inputs,0);
  MultiFileReader::CreateFileList
            ((MultiFileReader *)&file_list,context_00,(Value *)context,(FileGlobOptions)pvVar6);
  local_160.hive_types_schema._M_h._M_buckets = &local_160.hive_types_schema._M_h._M_single_bucket;
  local_160.filename = false;
  local_160.hive_partitioning = false;
  local_160.auto_detect_hive_partitioning = true;
  local_160.union_by_name = false;
  local_160.hive_types_autocast = true;
  local_160.mapping = BY_NAME;
  local_160.hive_types_schema._M_h._M_bucket_count = 1;
  local_160.hive_types_schema._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_160.hive_types_schema._M_h._M_element_count = 0;
  local_160.hive_types_schema._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_160.hive_types_schema._M_h._M_rehash_policy._M_next_resize = 0;
  local_160.hive_types_schema._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_160.filename_column._M_dataplus._M_p = (pointer)&local_160.filename_column.field_2;
  local_160.filename_column.field_2._M_allocated_capacity = 0x656d616e656c6966;
  local_160.filename_column._M_string_length = 8;
  local_160.filename_column.field_2._8_4_ = local_160.filename_column.field_2._8_4_ & 0xffffff00;
  local_160.custom_options._M_h._M_buckets = &local_160.custom_options._M_h._M_single_bucket;
  local_160.custom_options._M_h._M_bucket_count = 1;
  local_160.custom_options._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_160.custom_options._M_h._M_element_count = 0;
  local_160.custom_options._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_160.custom_options._M_h._M_rehash_policy._M_next_resize = 0;
  local_160.custom_options._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_1e8._16_8_ = return_types;
  local_1d0._M_allocated_capacity = (size_type)names;
  local_1d0._8_8_ = this;
  ParquetMultiFileInfo::InitializeOptions
            ((ClientContext *)local_218,(optional_ptr<duckdb::TableFunctionInfo,_true>)context);
  p_Var8 = (input->named_parameters->_M_h)._M_before_begin._M_nxt;
  if (p_Var8 != (_Hash_node_base *)0x0) {
    do {
      StringUtil::Lower(&loption,(string *)(p_Var8 + 1));
      pMVar7 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
               ::operator->((unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                             *)(local_218 + 8));
      iVar5 = (*pMVar7->_vptr_MultiFileReader[4])
                        (pMVar7,&loption,(Value *)(p_Var8 + 5),&local_160,context);
      if ((char)iVar5 == '\0') {
        base_options = unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
                       ::operator*((unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
                                    *)local_218);
        bVar4 = ParquetMultiFileInfo::ParseOption
                          (context,(string *)(p_Var8 + 1),(Value *)(p_Var8 + 5),&local_160,
                           base_options);
        if (!bVar4) {
          this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1c0,"Unimplemented option %s","");
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_180,p_Var8[1]._M_nxt,
                     (long)&(p_Var8[2]._M_nxt)->_M_nxt + (long)p_Var8[1]._M_nxt);
          NotImplementedException::NotImplementedException<std::__cxx11::string>
                    (this_01,&local_1c0,&local_180);
          __cxa_throw(this_01,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)loption._M_dataplus._M_p != &loption.field_2) {
        operator_delete(loption._M_dataplus._M_p);
      }
      p_Var8 = p_Var8->_M_nxt;
    } while (p_Var8 != (_Hash_node_base *)0x0);
  }
  this_00 = &local_160.custom_options;
  local_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_;
  local_218._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1e8._0_8_ =
       file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_1e8._8_8_ =
       file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c8.filename = local_160.filename;
  local_c8.hive_partitioning = local_160.hive_partitioning;
  local_c8.auto_detect_hive_partitioning = local_160.auto_detect_hive_partitioning;
  local_c8.union_by_name = local_160.union_by_name;
  local_c8.hive_types_autocast = local_160.hive_types_autocast;
  local_c8.mapping = local_160.mapping;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_c8.hive_types_schema._M_h,&local_160.hive_types_schema);
  paVar1 = &local_c8.filename_column.field_2;
  paVar2 = &local_160.filename_column.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.filename_column._M_dataplus._M_p == paVar2) {
    local_c8.filename_column.field_2._8_4_ = local_160.filename_column.field_2._8_4_;
    local_c8.filename_column.field_2._12_4_ = local_160.filename_column.field_2._12_4_;
    local_c8.filename_column._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c8.filename_column._M_dataplus._M_p = local_160.filename_column._M_dataplus._M_p;
  }
  local_c8.filename_column.field_2._M_allocated_capacity =
       local_160.filename_column.field_2._M_allocated_capacity;
  local_c8.filename_column._M_string_length = local_160.filename_column._M_string_length;
  local_160.filename_column._M_string_length = 0;
  local_160.filename_column.field_2._M_allocated_capacity =
       local_160.filename_column.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_160.filename_column._M_dataplus._M_p = (pointer)paVar2;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_c8.custom_options._M_h,this_00,this_00);
  uVar3 = local_1d0._8_8_;
  local_208._M_p = (pointer)local_218._0_8_;
  local_218._0_8_ =
       (__uniq_ptr_data<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true,_true>
        )0x0;
  MultiFileBindInternal
            ((MultiFileFunction<duckdb::ParquetMultiFileInfo> *)local_1d0._8_8_,context,
             (unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
              *)&local_200,(shared_ptr<duckdb::MultiFileList,_true> *)local_1e8,
             (vector<duckdb::LogicalType,_true> *)local_1e8._16_8_,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)local_1d0._M_allocated_capacity,&local_c8,
             (unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
              *)&local_208);
  if ((_Tuple_impl<0UL,_duckdb::BaseFileReaderOptions_*,_std::default_delete<duckdb::BaseFileReaderOptions>_>
       )local_208._M_p != (BaseFileReaderOptions *)0x0) {
    (**(code **)(*(long *)local_208._M_p + 8))();
  }
  local_208._M_p = (pointer)0x0;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_c8.custom_options._M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.filename_column._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.filename_column._M_dataplus._M_p);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_c8.hive_types_schema._M_h);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
  }
  if (local_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(local_200._M_pi)->_vptr__Sp_counted_base[1])();
  }
  local_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((element_type *)local_218._0_8_ != (element_type *)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_218._0_8_)->__weak_this_).
                internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
              ();
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&this_00->_M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.filename_column._M_dataplus._M_p != &local_160.filename_column.field_2) {
    operator_delete(local_160.filename_column._M_dataplus._M_p);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_160.hive_types_schema._M_h);
  if (file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (file_list.internal.
               super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(*(_func_int ***)local_218._8_8_)[1])();
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)uVar3;
}

Assistant:

static unique_ptr<FunctionData> MultiFileBind(ClientContext &context, TableFunctionBindInput &input,
	                                              vector<LogicalType> &return_types, vector<string> &names) {
		auto multi_file_reader = MultiFileReader::Create(input.table_function);
		auto file_list = multi_file_reader->CreateFileList(context, input.inputs[0]);
		MultiFileOptions file_options;

		auto options = OP::InitializeOptions(context, input.info);
		for (auto &kv : input.named_parameters) {
			auto loption = StringUtil::Lower(kv.first);
			if (multi_file_reader->ParseOption(loption, kv.second, file_options, context)) {
				continue;
			}
			if (OP::ParseOption(context, kv.first, kv.second, file_options, *options)) {
				continue;
			}
			throw NotImplementedException("Unimplemented option %s", kv.first);
		}
		return MultiFileBindInternal(context, std::move(multi_file_reader), std::move(file_list), return_types, names,
		                             std::move(file_options), std::move(options));
	}